

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoothsort.h
# Opt level: O0

void __thiscall
sorted_ptr_arr<double>::assign<std::vector<double,std::allocator<double>>>
          (sorted_ptr_arr<double> *this,vector<double,_std::allocator<double>_> *data)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  size_type sVar4;
  ulong uVar5;
  smoothsort_ptr<double> *psVar6;
  reference rhs;
  smoothsort_ptr<double> *local_70;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  iterator it;
  iterator iStack_30;
  uint i;
  iterator it_end;
  vector<double,_std::allocator<double>_> *data_local;
  sorted_ptr_arr<double> *this_local;
  
  if ((this->ptr_arr != (smoothsort_ptr<double> *)0x0) &&
     (this->ptr_arr != (smoothsort_ptr<double> *)0x0)) {
    operator_delete__(this->ptr_arr);
  }
  sVar4 = std::vector<double,_std::allocator<double>_>::size(data);
  this->N = sVar4;
  uVar1 = this->N;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  uVar5 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  psVar6 = (smoothsort_ptr<double> *)operator_new__(uVar5);
  if (uVar1 != 0) {
    local_70 = psVar6;
    do {
      smoothsort_ptr<double>::smoothsort_ptr(local_70);
      local_70 = local_70 + 1;
    } while (local_70 != psVar6 + uVar1);
  }
  this->ptr_arr = psVar6;
  iStack_30 = std::vector<double,_std::allocator<double>_>::end(data);
  it._M_current._4_4_ = 0;
  local_40._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(data);
  while ((bVar3 = __gnu_cxx::operator!=(&local_40,&stack0xffffffffffffffd0), bVar3 &&
         ((ulong)it._M_current._4_4_ != this->N))) {
    rhs = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
          operator*(&local_40);
    smoothsort_ptr<double>::operator=(this->ptr_arr + it._M_current._4_4_,rhs);
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_40);
  }
  sort(this);
  return;
}

Assistant:

void assign(TContainer &data) {
		if(ptr_arr != NULL) { delete[] ptr_arr; }
		N = data.size();
		ptr_arr = new smoothsort_ptr<T>[N];
		typename TContainer::iterator it_end = data.end();
		unsigned int i=0;
		for(typename TContainer::iterator it = data.begin(); it != it_end; ++it) {
			if(i == N) { break; }
			ptr_arr[i] = &(*it);
			i++;
		}
		sort();
	}